

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,char *filename,ContextInitializer *ctxtinit,int numThreads)

{
  undefined4 in_ECX;
  Context **in_RDX;
  undefined8 in_RSI;
  Context *in_RDI;
  Data *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  
  Context::Context(in_RDI,in_RSI,in_RDX);
  std::make_shared<Imf_3_4::DeepScanLineInputFile::Data,Imf_3_4::Context*,int,int&>
            (in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int *)in_RDI);
  std::
  __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a4bf8);
  Data::initialize(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (
    const char*               filename,
    const ContextInitializer& ctxtinit,
    int                       numThreads)
    : _ctxt (filename, ctxtinit, Context::read_mode_t{})
    , _data (std::make_shared<Data> (&_ctxt, 0, numThreads))
{
    _data->initialize ();
}